

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshader.cpp
# Opt level: O2

QByteArray * __thiscall
QShader::serialized(QByteArray *__return_storage_ptr__,QShader *this,SerializedFormatVersion version
                   )

{
  QMapData<std::map<QShaderKey,_QShaderCode,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QShaderCode>_>_>_>
  *pQVar1;
  QMapData<std::map<QShaderKey,_QMap<int,_std::pair<int,_int>_>,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QMap<int,_std::pair<int,_int>_>_>_>_>_>
  *pQVar2;
  QMapData<std::map<QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>_>_>_>_>
  *pQVar3;
  QMapData<std::map<QShaderKey,_QShader::NativeShaderInfo,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QShader::NativeShaderInfo>_>_>_>
  *pQVar4;
  char cVar5;
  int iVar6;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  QByteArray *data;
  QShaderPrivate *pQVar9;
  _Rb_tree_node_base *p_Var10;
  uint version_00;
  _Base_ptr p_Var11;
  long lVar12;
  _Rb_tree_node_base *p_Var13;
  long in_FS_OFFSET;
  QShaderCode local_c8;
  QShaderCode local_98;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (serialized(QShader::SerializedFormatVersion)::sd == '\0') {
    iVar6 = __cxa_guard_acquire(&serialized(QShader::SerializedFormatVersion)::sd);
    if (iVar6 != 0) {
      QShaderPrivate::QShaderPrivate(&serialized::sd);
      __cxa_atexit(QShaderPrivate::~QShaderPrivate,&serialized::sd,&__dso_handle);
      __cxa_guard_release(&serialized(QShader::SerializedFormatVersion)::sd);
    }
  }
  pQVar9 = &serialized::sd;
  if (this->d != (QShaderPrivate *)0x0) {
    pQVar9 = this->d;
  }
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  iVar6 = 0;
  QBuffer::QBuffer((QBuffer *)&local_68,(QObject *)0x0);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,(QIODevice *)&local_68);
  puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,0x11);
  cVar5 = QBuffer::open((QBuffer *)&local_68,2);
  if (cVar5 == '\0') {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    version_00 = 6;
    if (version != Qt_6_4) {
      version_00 = version == Qt_6_5 ^ 9;
    }
    QDataStream::operator<<((QDataStream *)&local_58,version_00);
    QDataStream::operator<<((QDataStream *)&local_58,pQVar9->stage);
    QShaderDescription::serialize(&pQVar9->desc,(QDataStream *)&local_58,version_00);
    pQVar1 = (pQVar9->shaders).d.d.ptr;
    if (pQVar1 != (QMapData<std::map<QShaderKey,_QShaderCode,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QShaderCode>_>_>_>
                   *)0x0) {
      iVar6 = (int)(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    QDataStream::operator<<((QDataStream *)&local_58,iVar6);
    pQVar1 = (pQVar9->shaders).d.d.ptr;
    if (pQVar1 == (QMapData<std::map<QShaderKey,_QShaderCode,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QShaderCode>_>_>_>
                   *)0x0) {
      p_Var7 = (_Base_ptr)0x0;
    }
    else {
      p_Var7 = *(_Base_ptr *)
                ((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    }
    p_Var10 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar1 == (QMapData<std::map<QShaderKey,_QShaderCode,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QShaderCode>_>_>_>
                   *)0x0) {
      p_Var10 = (_Rb_tree_node_base *)0x0;
    }
    for (; p_Var7 != p_Var10; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      writeShaderKey((QDataStream *)&local_58,(QShaderKey *)(p_Var7 + 1));
      local_c8.m_entryPoint.d.ptr = (char *)0x0;
      local_c8.m_entryPoint.d.size = 0;
      local_c8.m_shader.d.size = 0;
      local_c8.m_entryPoint.d.d = (Data *)0x0;
      local_c8.m_shader.d.d = (Data *)0x0;
      local_c8.m_shader.d.ptr = (char *)0x0;
      QMap<QShaderKey,_QShaderCode>::value
                (&local_98,&pQVar9->shaders,(QShaderKey *)(p_Var7 + 1),&local_c8);
      QShaderCode::~QShaderCode(&local_c8);
      local_c8.m_shader.d.d = local_98.m_shader.d.d;
      local_c8.m_shader.d.ptr = local_98.m_shader.d.ptr;
      local_c8.m_shader.d.size = local_98.m_shader.d.size;
      if (local_98.m_shader.d.d != (Data *)0x0) {
        LOCK();
        ((local_98.m_shader.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.m_shader.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + 1;
        UNLOCK();
      }
      ::operator<<((QDataStream *)&local_58,&local_c8.m_shader);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c8);
      local_c8.m_shader.d.d = local_98.m_entryPoint.d.d;
      local_c8.m_shader.d.ptr = local_98.m_entryPoint.d.ptr;
      local_c8.m_shader.d.size = local_98.m_entryPoint.d.size;
      if (local_98.m_entryPoint.d.d != (Data *)0x0) {
        LOCK();
        ((local_98.m_entryPoint.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_98.m_entryPoint.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ::operator<<((QDataStream *)&local_58,&local_c8.m_shader);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c8);
      QShaderCode::~QShaderCode(&local_98);
    }
    pQVar2 = (pQVar9->bindings).d.d.ptr;
    if (pQVar2 == (QMapData<std::map<QShaderKey,_QMap<int,_std::pair<int,_int>_>,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QMap<int,_std::pair<int,_int>_>_>_>_>_>
                   *)0x0) {
      iVar6 = 0;
    }
    else {
      iVar6 = (int)(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    QDataStream::operator<<((QDataStream *)&local_58,iVar6);
    pQVar2 = (pQVar9->bindings).d.d.ptr;
    if (pQVar2 == (QMapData<std::map<QShaderKey,_QMap<int,_std::pair<int,_int>_>,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QMap<int,_std::pair<int,_int>_>_>_>_>_>
                   *)0x0) {
      p_Var7 = (_Base_ptr)0x0;
    }
    else {
      p_Var7 = *(_Base_ptr *)
                ((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    }
    p_Var10 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar2 == (QMapData<std::map<QShaderKey,_QMap<int,_std::pair<int,_int>_>,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QMap<int,_std::pair<int,_int>_>_>_>_>_>
                   *)0x0) {
      p_Var10 = (_Rb_tree_node_base *)0x0;
    }
    for (; p_Var7 != p_Var10; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      writeShaderKey((QDataStream *)&local_58,(QShaderKey *)(p_Var7 + 1));
      if (p_Var7[1]._M_left == (_Base_ptr)0x0) {
        iVar6 = 0;
      }
      else {
        iVar6 = *(int *)&p_Var7[1]._M_left[1]._M_left;
      }
      QDataStream::operator<<((QDataStream *)&local_58,iVar6);
      p_Var11 = p_Var7[1]._M_left;
      if (p_Var11 == (_Base_ptr)0x0) {
        p_Var8 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var8 = *(_Rb_tree_node_base **)(p_Var11 + 1);
      }
      p_Var13 = (_Rb_tree_node_base *)&p_Var11->_M_left;
      if (p_Var11 == (_Base_ptr)0x0) {
        p_Var13 = (_Rb_tree_node_base *)0x0;
      }
      for (; p_Var8 != p_Var13; p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        QDataStream::operator<<((QDataStream *)&local_58,p_Var8[1]._M_color);
        QDataStream::operator<<((QDataStream *)&local_58,*(int *)&p_Var8[1].field_0x4);
        QDataStream::operator<<((QDataStream *)&local_58,*(int *)&p_Var8[1]._M_parent);
      }
    }
    pQVar3 = (pQVar9->combinedImageMap).d.d.ptr;
    if (pQVar3 == (QMapData<std::map<QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>_>_>_>_>
                   *)0x0) {
      iVar6 = 0;
    }
    else {
      iVar6 = (int)(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    QDataStream::operator<<((QDataStream *)&local_58,iVar6);
    pQVar3 = (pQVar9->combinedImageMap).d.d.ptr;
    if (pQVar3 == (QMapData<std::map<QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>_>_>_>_>
                   *)0x0) {
      p_Var7 = (_Base_ptr)0x0;
    }
    else {
      p_Var7 = *(_Base_ptr *)
                ((long)&(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    }
    p_Var10 = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar3 == (QMapData<std::map<QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>_>_>_>_>
                   *)0x0) {
      p_Var10 = (_Rb_tree_node_base *)0x0;
    }
    for (; p_Var7 != p_Var10; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      writeShaderKey((QDataStream *)&local_58,(QShaderKey *)(p_Var7 + 1));
      QDataStream::operator<<((QDataStream *)&local_58,p_Var7[2]._M_color);
      p_Var11 = p_Var7[1]._M_right;
      for (lVar12 = *(long *)(p_Var7 + 2) << 5; lVar12 != 0; lVar12 = lVar12 + -0x20) {
        ::operator<<((QDataStream *)&local_58,(QByteArray *)p_Var11);
        QDataStream::operator<<((QDataStream *)&local_58,*(int *)&p_Var11->_M_right);
        QDataStream::operator<<((QDataStream *)&local_58,*(int *)((long)&p_Var11->_M_right + 4));
        p_Var11 = p_Var11 + 1;
      }
    }
    if (version != Qt_6_4) {
      pQVar4 = (pQVar9->nativeShaderInfoMap).d.d.ptr;
      if (pQVar4 == (QMapData<std::map<QShaderKey,_QShader::NativeShaderInfo,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QShader::NativeShaderInfo>_>_>_>
                     *)0x0) {
        iVar6 = 0;
      }
      else {
        iVar6 = (int)(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      QDataStream::operator<<((QDataStream *)&local_58,iVar6);
      pQVar4 = (pQVar9->nativeShaderInfoMap).d.d.ptr;
      if (pQVar4 == (QMapData<std::map<QShaderKey,_QShader::NativeShaderInfo,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QShader::NativeShaderInfo>_>_>_>
                     *)0x0) {
        p_Var7 = (_Base_ptr)0x0;
      }
      else {
        p_Var7 = *(_Base_ptr *)
                  ((long)&(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      }
      p_Var10 = &(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar4 == (QMapData<std::map<QShaderKey,_QShader::NativeShaderInfo,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QShader::NativeShaderInfo>_>_>_>
                     *)0x0) {
        p_Var10 = (_Rb_tree_node_base *)0x0;
      }
      for (; p_Var7 != p_Var10; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        writeShaderKey((QDataStream *)&local_58,(QShaderKey *)(p_Var7 + 1));
        QDataStream::operator<<((QDataStream *)&local_58,*(int *)&p_Var7[1]._M_left);
        if (p_Var7[1]._M_right == (_Base_ptr)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = *(int *)&p_Var7[1]._M_right[1]._M_left;
        }
        QDataStream::operator<<((QDataStream *)&local_58,iVar6);
        p_Var11 = p_Var7[1]._M_right;
        if (p_Var11 == (_Base_ptr)0x0) {
          p_Var8 = (_Rb_tree_node_base *)0x0;
        }
        else {
          p_Var8 = *(_Rb_tree_node_base **)(p_Var11 + 1);
        }
        p_Var13 = (_Rb_tree_node_base *)&p_Var11->_M_left;
        if (p_Var11 == (_Base_ptr)0x0) {
          p_Var13 = (_Rb_tree_node_base *)0x0;
        }
        for (; p_Var8 != p_Var13; p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          QDataStream::operator<<((QDataStream *)&local_58,p_Var8[1]._M_color);
          QDataStream::operator<<((QDataStream *)&local_58,*(int *)&p_Var8[1].field_0x4);
        }
      }
    }
    data = (QByteArray *)QBuffer::buffer();
    qCompress(__return_storage_ptr__,data,-1);
  }
  QDataStream::~QDataStream((QDataStream *)&local_58);
  QBuffer::~QBuffer((QBuffer *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QShader::serialized(SerializedFormatVersion version) const
{
    static QShaderPrivate sd;
    QShaderPrivate *dd = d ? d : &sd;

    QBuffer buf;
    QDataStream ds(&buf);
    ds.setVersion(QDataStream::Qt_5_10);
    if (!buf.open(QIODevice::WriteOnly))
        return QByteArray();

    const int qsbVersion = QShaderPrivate::qtQsbVersion(version);
    ds << qsbVersion;

    ds << int(dd->stage);
    dd->desc.serialize(&ds, qsbVersion);
    ds << int(dd->shaders.size());
    for (auto it = dd->shaders.cbegin(), itEnd = dd->shaders.cend(); it != itEnd; ++it) {
        const QShaderKey &k(it.key());
        writeShaderKey(&ds, k);
        const QShaderCode &shader(dd->shaders.value(k));
        ds << shader.shader();
        ds << shader.entryPoint();
    }
    ds << int(dd->bindings.size());
    for (auto it = dd->bindings.cbegin(), itEnd = dd->bindings.cend(); it != itEnd; ++it) {
        const QShaderKey &k(it.key());
        writeShaderKey(&ds, k);
        const NativeResourceBindingMap &map(it.value());
        ds << int(map.size());
        for (auto mapIt = map.cbegin(), mapItEnd = map.cend(); mapIt != mapItEnd; ++mapIt) {
            ds << mapIt.key();
            ds << mapIt.value().first;
            ds << mapIt.value().second;
        }
    }
    ds << int(dd->combinedImageMap.size());
    for (auto it = dd->combinedImageMap.cbegin(), itEnd = dd->combinedImageMap.cend(); it != itEnd; ++it) {
        const QShaderKey &k(it.key());
        writeShaderKey(&ds, k);
        const SeparateToCombinedImageSamplerMappingList &list(it.value());
        ds << int(list.size());
        for (auto listIt = list.cbegin(), listItEnd = list.cend(); listIt != listItEnd; ++listIt) {
            ds << listIt->combinedSamplerName;
            ds << listIt->textureBinding;
            ds << listIt->samplerBinding;
        }
    }
    if (qsbVersion > QShaderPrivate::QSB_VERSION_WITHOUT_NATIVE_SHADER_INFO) {
        ds << int(dd->nativeShaderInfoMap.size());
        for (auto it = dd->nativeShaderInfoMap.cbegin(), itEnd = dd->nativeShaderInfoMap.cend(); it != itEnd; ++it) {
            const QShaderKey &k(it.key());
            writeShaderKey(&ds, k);
            ds << it->flags;
            ds << int(it->extraBufferBindings.size());
            for (auto mapIt = it->extraBufferBindings.cbegin(), mapItEnd = it->extraBufferBindings.cend();
                 mapIt != mapItEnd; ++mapIt)
            {
                ds << mapIt.key();
                ds << mapIt.value();
            }
        }
    }

    return qCompress(buf.buffer());
}